

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O2

lexeme_t<cfgfile::string_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
          (lexeme_t<cfgfile::string_trait_t> *__return_storage_ptr__,
          lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  input_stream_t<cfgfile::string_trait_t> *this_00;
  pos_t pVar1;
  bool bVar2;
  bool bVar3;
  char_t cVar4;
  bool bVar5;
  bool bVar6;
  exception_t<cfgfile::string_trait_t> *peVar7;
  char_t new_char;
  allocator local_295;
  char_t local_294;
  allocator local_293;
  allocator local_292;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string_t result;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  skip_spaces(this);
  this_00 = this->m_stream;
  pVar1 = this_00->m_column_number;
  this->m_line_number = this_00->m_line_number;
  this->m_column_number = pVar1;
  bVar3 = input_stream_t<cfgfile::string_trait_t>::at_end(this_00);
  if (bVar3) {
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_type = null;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_value,(string *)&local_290);
  }
  else {
    bVar2 = true;
    bVar3 = false;
LAB_001216c3:
    cVar4 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
    if (cVar4 == const_t<cfgfile::string_trait_t>::c_quotes) {
      if (bVar3) goto LAB_00121884;
      if (!bVar2) {
LAB_0012187a:
        input_stream_t<cfgfile::string_trait_t>::put_back(this->m_stream,cVar4);
        goto LAB_00121884;
      }
      bVar3 = true;
LAB_00121769:
      bVar5 = false;
    }
    else {
      if (cVar4 == const_t<cfgfile::string_trait_t>::c_back_slash) {
        new_char = '\0';
        if ((bVar3) && (bVar5 = process_back_slash(this,&new_char), !bVar5)) {
          peVar7 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_190,"Unrecognized back-slash sequence: \"\\",&local_295);
          std::__cxx11::string::string((string *)&local_170,(string *)&local_190);
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_270,'\x01');
          std::operator+(&local_150,&local_170,&local_270);
          std::__cxx11::string::string(local_1d0,"\". In file \"",&local_291);
          std::__cxx11::string::string((string *)&local_1b0,local_1d0);
          std::operator+(&local_130,&local_150,&local_1b0);
          std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
          std::__cxx11::string::string((string *)&local_210,"\" on line ",&local_292);
          std::__cxx11::string::string((string *)&local_1f0,(string *)&local_210);
          std::operator+(&local_f0,&local_110,&local_1f0);
          std::__cxx11::to_string(&local_230,this->m_line_number);
          std::operator+(&local_290,&local_f0,&local_230);
          std::__cxx11::string::string((string *)local_d0,".",&local_293);
          std::__cxx11::string::string((string *)&local_b0,(string *)local_d0);
          std::operator+(&local_50,&local_290,&local_b0);
          exception_t<cfgfile::string_trait_t>::exception_t(peVar7,&local_50);
          __cxa_throw(peVar7,&exception_t<cfgfile::string_trait_t>::typeinfo,
                      exception_t<cfgfile::string_trait_t>::~exception_t);
        }
        std::__cxx11::string::push_back((char)&result);
        goto LAB_00121769;
      }
      if (cVar4 == const_t<cfgfile::string_trait_t>::c_begin_tag) {
        if (result._M_string_length != 0) {
LAB_00121753:
          if (!bVar3) goto LAB_0012187a;
LAB_0012175d:
          std::__cxx11::string::push_back((char)&result);
          goto LAB_00121769;
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_290,'\x01');
        __return_storage_ptr__->m_type = start;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_value,(string *)&local_290);
        goto LAB_001216ab;
      }
      if (cVar4 == const_t<cfgfile::string_trait_t>::c_end_tag) {
        if (result._M_string_length != 0) goto LAB_00121753;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_290,'\x01');
        __return_storage_ptr__->m_type = finish;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_value,(string *)&local_290);
        goto LAB_001216ab;
      }
      if ((cVar4 == const_t<cfgfile::string_trait_t>::c_space) ||
         (cVar4 == const_t<cfgfile::string_trait_t>::c_tab)) {
        if (bVar3) goto LAB_0012175d;
        goto LAB_00121884;
      }
      if ((cVar4 == const_t<cfgfile::string_trait_t>::c_carriage_return) ||
         (cVar4 == const_t<cfgfile::string_trait_t>::c_line_feed)) {
        if (bVar3) {
          peVar7 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_170,"Unfinished quoted lexeme. ",(allocator *)&local_b0);
          std::__cxx11::string::string((string *)&local_150,(string *)&local_170);
          std::__cxx11::string::string
                    ((string *)&local_270,"New line detected. In file \"",local_d0);
          std::__cxx11::string::string((string *)&local_190,(string *)&local_270);
          std::operator+(&local_130,&local_150,&local_190);
          std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
          std::__cxx11::string::string(local_1d0,"\" on line ",(allocator *)&new_char);
          std::__cxx11::string::string((string *)&local_1b0,local_1d0);
          std::operator+(&local_f0,&local_110,&local_1b0);
          std::__cxx11::to_string(&local_1f0,this->m_line_number);
          std::operator+(&local_290,&local_f0,&local_1f0);
          std::__cxx11::string::string((string *)&local_230,".",&local_295);
          std::__cxx11::string::string((string *)&local_210,(string *)&local_230);
          std::operator+(&local_70,&local_290,&local_210);
          exception_t<cfgfile::string_trait_t>::exception_t(peVar7,&local_70);
          __cxa_throw(peVar7,&exception_t<cfgfile::string_trait_t>::typeinfo,
                      exception_t<cfgfile::string_trait_t>::~exception_t);
        }
        goto LAB_00121884;
      }
      if (((cVar4 != const_t<cfgfile::string_trait_t>::c_vertical_bar) || (bVar3)) ||
         (bVar5 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream), bVar5))
      goto LAB_0012175d;
      cVar4 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
      if (cVar4 == const_t<cfgfile::string_trait_t>::c_vertical_bar) {
        skip_one_line_comment(this);
      }
      else {
        local_294 = cVar4;
        if (cVar4 != const_t<cfgfile::string_trait_t>::c_sharp) {
          std::__cxx11::string::push_back((char)&result);
          input_stream_t<cfgfile::string_trait_t>::put_back(this->m_stream,local_294);
          goto LAB_00121769;
        }
        skip_multi_line_comment(this);
      }
      if (!bVar2) goto LAB_00121884;
      bVar5 = true;
      skip_spaces(this);
    }
    bVar6 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
    if (!bVar6) {
      if (!bVar5) {
        bVar2 = false;
      }
      goto LAB_001216c3;
    }
    if (bVar3) {
      peVar7 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_170,"Unfinished quoted lexeme. ",(allocator *)&local_b0);
      std::__cxx11::string::string((string *)&local_150,(string *)&local_170);
      std::__cxx11::string::string((string *)&local_270,"End of file riched. In file \"",local_d0);
      std::__cxx11::string::string((string *)&local_190,(string *)&local_270);
      std::operator+(&local_130,&local_150,&local_190);
      std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
      std::__cxx11::string::string(local_1d0,"\" on line ",(allocator *)&new_char);
      std::__cxx11::string::string((string *)&local_1b0,local_1d0);
      std::operator+(&local_f0,&local_110,&local_1b0);
      std::__cxx11::to_string(&local_1f0,this->m_line_number);
      std::operator+(&local_290,&local_f0,&local_1f0);
      std::__cxx11::string::string((string *)&local_230,".",&local_295);
      std::__cxx11::string::string((string *)&local_210,(string *)&local_230);
      std::operator+(&local_90,&local_290,&local_210);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar7,&local_90);
      __cxa_throw(peVar7,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    if (result._M_string_length != 0) {
LAB_00121884:
      __return_storage_ptr__->m_type = string;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_value,(string *)&result);
      goto LAB_00121899;
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_type = null;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_value,(string *)&local_290);
  }
LAB_001216ab:
  std::__cxx11::string::~string((string *)&local_290);
LAB_00121899:
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}